

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_
          (string *__return_storage_ptr__,QPDFAnnotationObjectHelper *this)

{
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHelper local_38;
  QPDFAnnotationObjectHelper *this_local;
  
  local_38.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local = (QPDFAnnotationObjectHelper *)__return_storage_ptr__;
  QPDFObjectHelper::oh(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/Subtype",&local_59);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)&local_38);
  QPDFObjectHandle::getName_abi_cxx11_
            (__return_storage_ptr__,
             (QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFAnnotationObjectHelper::getSubtype()
{
    return oh().getKey("/Subtype").getName();
}